

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp.hpp
# Opt level: O3

void duckdb::alp::AlpCompression<float,_true>::FindTopKCombinations
               (vector<duckdb::vector<float,_true>,_true> *vectors_sampled,State *state)

{
  pointer *ppAVar1;
  iterator __position;
  long lVar2;
  uint64_t uVar3;
  undefined6 uVar4;
  pointer __last;
  State *pSVar5;
  byte bVar6;
  pointer pAVar7;
  mapped_type *pmVar8;
  reference __args;
  ulong uVar9;
  short sVar10;
  short sVar11;
  __node_base _Var12;
  AlpEncodingIndices encoding_indices;
  short sVar13;
  size_type __n;
  AlpEncodingIndices AVar14;
  vector<float,_true> *sampled_vector;
  pointer input_vector;
  ushort uVar15;
  bool bVar16;
  vector<duckdb::alp::AlpCombination,_true> best_k_combinations;
  unordered_map<duckdb::alp::AlpEncodingIndices,_unsigned_long,_duckdb::alp::AlpEncodingIndicesHash,_duckdb::alp::AlpEncodingIndicesEquality,_std::allocator<std::pair<const_duckdb::alp::AlpEncodingIndices,_unsigned_long>_>_>
  best_k_combinations_hash;
  vector<duckdb::alp::AlpCombination,_true> local_98;
  int local_7c;
  State *local_78;
  pointer local_70;
  _Hashtable<duckdb::alp::AlpEncodingIndices,_std::pair<const_duckdb::alp::AlpEncodingIndices,_unsigned_long>,_std::allocator<std::pair<const_duckdb::alp::AlpEncodingIndices,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::alp::AlpEncodingIndicesEquality,_duckdb::alp::AlpEncodingIndicesHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  pAVar7 = (state->best_k_combinations).
           super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
           super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((state->best_k_combinations).
      super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
      super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
      _M_impl.super__Vector_impl_data._M_finish != pAVar7) {
    (state->best_k_combinations).
    super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
    super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
    _M_impl.super__Vector_impl_data._M_finish = pAVar7;
  }
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  input_vector = (vectors_sampled->
                 super_vector<duckdb::vector<float,_true>,_std::allocator<duckdb::vector<float,_true>_>_>
                 ).
                 super__Vector_base<duckdb::vector<float,_true>,_std::allocator<duckdb::vector<float,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_70 = (vectors_sampled->
             super_vector<duckdb::vector<float,_true>,_std::allocator<duckdb::vector<float,_true>_>_>
             ).
             super__Vector_base<duckdb::vector<float,_true>,_std::allocator<duckdb::vector<float,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pSVar5 = state;
  if (input_vector != local_70) {
    do {
      local_78 = pSVar5;
      local_98.
      super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
      super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)(((long)(input_vector->super_vector<float,_std::allocator<float>_>).
                            super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(input_vector->super_vector<float,_std::allocator<float>_>).
                           super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start) * 0x14);
      local_98.
      super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
      super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT62(local_98.
                             super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                             .
                             super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                             ._M_impl.super__Vector_impl_data._M_start._2_6_,0xa0a);
      local_98.
      super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
      super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar15 = 10;
      sVar10 = 0xb;
      encoding_indices.exponent = '\n';
      encoding_indices.factor = '\n';
      AVar14 = encoding_indices;
      sVar13 = sVar10;
      do {
        do {
          pAVar7 = (pointer)DryCompressToEstimateSize<true>(input_vector,encoding_indices);
          if (local_98.
              super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
              .
              super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
              ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
            if (pAVar7 < local_98.
                         super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                         .
                         super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_016e4637:
              local_98.
              super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
              .
              super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)CONCAT62(local_98.
                                     super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                                     .
                                     super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                                     ._M_impl.super__Vector_impl_data._M_start._2_6_,
                                     encoding_indices);
              local_98.
              super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
              .
              super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_98.
              super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
              .
              super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = pAVar7;
            }
            else if (pAVar7 == local_98.
                               super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                               .
                               super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              if (((byte)local_98.
                         super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                         .
                         super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_ < uVar15) ||
                 ((uVar15 == (byte)local_98.
                                   super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                                   .
                                   super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                                   ._M_impl.super__Vector_impl_data._M_start._0_1_ &&
                  ((ushort)local_98.
                           super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                           .
                           super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_1_ < (ushort)(sVar10 - 1U)))
                 )) goto LAB_016e4637;
            }
          }
          encoding_indices = (AlpEncodingIndices)((short)encoding_indices + -0x100);
          sVar11 = sVar10 + -1;
          bVar16 = 0 < sVar10;
          sVar10 = sVar11;
        } while (sVar11 != 0 && bVar16);
        sVar10 = sVar13 + -1;
        encoding_indices = (AlpEncodingIndices)((short)AVar14 + -0x101);
        bVar16 = uVar15 != 0;
        uVar15 = uVar15 - 1;
        AVar14 = encoding_indices;
        sVar13 = sVar10;
      } while (bVar16);
      pmVar8 = ::std::__detail::
               _Map_base<duckdb::alp::AlpEncodingIndices,_std::pair<const_duckdb::alp::AlpEncodingIndices,_unsigned_long>,_std::allocator<std::pair<const_duckdb::alp::AlpEncodingIndices,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::alp::AlpEncodingIndicesEquality,_duckdb::alp::AlpEncodingIndicesHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<duckdb::alp::AlpEncodingIndices,_std::pair<const_duckdb::alp::AlpEncodingIndices,_unsigned_long>,_std::allocator<std::pair<const_duckdb::alp::AlpEncodingIndices,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::alp::AlpEncodingIndicesEquality,_duckdb::alp::AlpEncodingIndicesHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&local_68,(key_type *)&local_98);
      state = local_78;
      *pmVar8 = *pmVar8 + 1;
      input_vector = input_vector + 1;
      pSVar5 = local_78;
    } while (input_vector != local_70);
    local_98.super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
    .super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
    _M_impl.super__Vector_impl_data._M_start = (AlpCombination *)0x0;
    local_98.super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
    .super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
    _M_impl.super__Vector_impl_data._M_finish = (AlpCombination *)0x0;
    local_98.super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
    .super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      _Var12._M_nxt = local_68._M_before_begin._M_nxt;
      do {
        local_7c = 0;
        ::std::vector<duckdb::alp::AlpCombination,std::allocator<duckdb::alp::AlpCombination>>::
        emplace_back<duckdb::alp::AlpEncodingIndices_const&,unsigned_long_const&,int>
                  ((vector<duckdb::alp::AlpCombination,std::allocator<duckdb::alp::AlpCombination>>
                    *)&local_98,(AlpEncodingIndices *)(_Var12._M_nxt + 1),
                   (unsigned_long *)(_Var12._M_nxt + 2),&local_7c);
        __last = local_98.
                 super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                 .
                 super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pAVar7 = local_98.
                 super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                 .
                 super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        _Var12._M_nxt = (_Var12._M_nxt)->_M_nxt;
      } while (_Var12._M_nxt != (_Hash_node_base *)0x0);
      if (local_98.
          super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
          super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_98.
          super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
          super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar9 = ((long)local_98.
                       super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                       .
                       super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_98.
                       super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                       .
                       super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        lVar2 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        ::std::
        __introsort_loop<__gnu_cxx::__normal_iterator<duckdb::alp::AlpCombination*,std::vector<duckdb::alp::AlpCombination,std::allocator<duckdb::alp::AlpCombination>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(duckdb::alp::AlpCombination_const&,duckdb::alp::AlpCombination_const&)>>
                  ((__normal_iterator<duckdb::alp::AlpCombination_*,_std::vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>_>
                    )local_98.
                     super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                     .
                     super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<duckdb::alp::AlpCombination_*,_std::vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>_>
                    )local_98.
                     super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                     .
                     super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                   (ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<bool_(*)(const_duckdb::alp::AlpCombination_&,_const_duckdb::alp::AlpCombination_&)>
                    )CompareALPCombinations);
        ::std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<duckdb::alp::AlpCombination*,std::vector<duckdb::alp::AlpCombination,std::allocator<duckdb::alp::AlpCombination>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(duckdb::alp::AlpCombination_const&,duckdb::alp::AlpCombination_const&)>>
                  ((__normal_iterator<duckdb::alp::AlpCombination_*,_std::vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>_>
                    )pAVar7,(__normal_iterator<duckdb::alp::AlpCombination_*,_std::vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>_>
                             )__last,
                   (_Iter_comp_iter<bool_(*)(const_duckdb::alp::AlpCombination_&,_const_duckdb::alp::AlpCombination_&)>
                    )CompareALPCombinations);
      }
      goto LAB_016e4761;
    }
  }
  local_98.super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
  super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
  super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
  _M_impl.super__Vector_impl_data._M_finish = (AlpCombination *)0x0;
  local_98.super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
  super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
  _M_impl.super__Vector_impl_data._M_start = (AlpCombination *)0x0;
LAB_016e4761:
  if ((char)((char)((uint)((int)local_98.
                                super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                                .
                                super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (int)local_98.
                               super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                               .
                               super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55) != '\0') {
    __n = 0;
    do {
      __args = vector<duckdb::alp::AlpCombination,_true>::operator[](&local_98,__n);
      __position._M_current =
           (state->best_k_combinations).
           super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
           super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (state->best_k_combinations).
          super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
          super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::alp::AlpCombination,std::allocator<duckdb::alp::AlpCombination>>::
        _M_realloc_insert<duckdb::alp::AlpCombination_const&>
                  ((vector<duckdb::alp::AlpCombination,std::allocator<duckdb::alp::AlpCombination>>
                    *)&state->best_k_combinations,__position,__args);
      }
      else {
        (__position._M_current)->estimated_compression_size = __args->estimated_compression_size;
        uVar4 = *(undefined6 *)&__args->field_0x2;
        uVar3 = __args->n_appearances;
        (__position._M_current)->encoding_indices = __args->encoding_indices;
        *(undefined6 *)&(__position._M_current)->field_0x2 = uVar4;
        (__position._M_current)->n_appearances = uVar3;
        ppAVar1 = &(state->best_k_combinations).
                   super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                   .
                   super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar1 = *ppAVar1 + 1;
      }
      __n = __n + 1;
      bVar6 = (char)((uint)((int)local_98.
                                 super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                                 .
                                 super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (int)local_98.
                                super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                                .
                                super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55;
      if (4 < bVar6) {
        bVar6 = 5;
      }
    } while (__n < bVar6);
  }
  if (local_98.
      super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
      super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
      _M_impl.super__Vector_impl_data._M_start != (AlpCombination *)0x0) {
    operator_delete(local_98.
                    super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                    .
                    super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::
  _Hashtable<duckdb::alp::AlpEncodingIndices,_std::pair<const_duckdb::alp::AlpEncodingIndices,_unsigned_long>,_std::allocator<std::pair<const_duckdb::alp::AlpEncodingIndices,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::alp::AlpEncodingIndicesEquality,_duckdb::alp::AlpEncodingIndicesHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

static void FindTopKCombinations(const vector<vector<T>> &vectors_sampled, State &state) {
		state.ResetCombinations();

		unordered_map<AlpEncodingIndices, uint64_t, AlpEncodingIndicesHash, AlpEncodingIndicesEquality>
		    best_k_combinations_hash;
		// For each vector sampled
		for (auto &sampled_vector : vectors_sampled) {
			idx_t n_samples = sampled_vector.size();
			AlpEncodingIndices best_encoding_indices = {AlpTypedConstants<T>::MAX_EXPONENT,
			                                            AlpTypedConstants<T>::MAX_EXPONENT};

			//! We start our optimization with the worst possible total bits obtained from compression
			idx_t best_total_bits = (n_samples * (EXACT_TYPE_BITSIZE + AlpConstants::EXCEPTION_POSITION_SIZE * 8)) +
			                        (n_samples * EXACT_TYPE_BITSIZE);

			// N of appearances is irrelevant at this phase; we search for the best compression for the vector
			AlpCombination best_combination = {best_encoding_indices, 0, best_total_bits};
			//! We try all combinations in search for the one which minimize the compression size
			for (int8_t exp_idx = AlpTypedConstants<T>::MAX_EXPONENT; exp_idx >= 0; exp_idx--) {
				for (int8_t factor_idx = exp_idx; factor_idx >= 0; factor_idx--) {
					AlpEncodingIndices current_encoding_indices = {(uint8_t)exp_idx, (uint8_t)factor_idx};
					uint64_t estimated_compression_size =
					    DryCompressToEstimateSize<true>(sampled_vector, current_encoding_indices);
					AlpCombination current_combination = {current_encoding_indices, 0, estimated_compression_size};
					if (CompareALPCombinations(current_combination, best_combination)) {
						best_combination = current_combination;
					}
				}
			}
			best_k_combinations_hash[best_combination.encoding_indices]++;
		}

		// Convert our hash to a Combination vector to be able to sort
		// Note that this vector is always small (< 10 combinations)
		vector<AlpCombination> best_k_combinations;
		for (auto const &combination : best_k_combinations_hash) {
			best_k_combinations.emplace_back(
			    combination.first,  // Encoding Indices
			    combination.second, // N of times it appeared (hash value)
			    0 // Compression size is irrelevant at this phase since we compare combinations from different vectors
			);
		}
		sort(best_k_combinations.begin(), best_k_combinations.end(), CompareALPCombinations);

		// Save k' best combinations
		for (idx_t i = 0; i < MinValue(AlpConstants::MAX_COMBINATIONS, (uint8_t)best_k_combinations.size()); i++) {
			state.best_k_combinations.push_back(best_k_combinations[i]);
		}
	}